

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

PatternPtr __thiscall trieste::detail::Inside<2UL>::custom_rep(Inside<2UL> *this)

{
  Token TVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  PatternPtr PVar2;
  array<trieste::Token,_2UL> local_18;
  
  if (*(long *)(in_RSI + 8) == 0) {
    std::make_shared<trieste::detail::InsideStar<2ul>,std::array<trieste::Token,2ul>&>(&local_18);
    TVar1.def = local_18._M_elems[1].def;
    local_18._M_elems[1].def = (TokenDef *)0x0;
    (this->super_PatternDef)._vptr_PatternDef = (_func_int **)local_18._M_elems[0].def;
    (this->super_PatternDef).continuation.
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)TVar1.def;
    local_18._M_elems[0].def = (TokenDef *)0x0;
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_18._M_elems + 1));
    in_RDX._M_pi = extraout_RDX;
  }
  else {
    (this->super_PatternDef)._vptr_PatternDef = (_func_int **)0x0;
    (this->super_PatternDef).continuation.
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  PVar2.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RDX._M_pi;
  PVar2.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_PatternDef;
  return (PatternPtr)
         PVar2.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PatternPtr custom_rep() override
      {
        // Rep(Inside) -> InsideStar
        if (no_continuation())
          return std::make_shared<InsideStar<N>>(types);
        return {};
      }